

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saa1099_mame.c
# Opt level: O1

void saa1099m_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  double *pdVar4;
  int iVar5;
  double *pdVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  DEV_SMPL output_l;
  DEV_SMPL output_r;
  int local_50;
  int local_4c;
  
  if (*(char *)((long)param + 0x16) == '\0') {
    memset(*outputs,0,(ulong)samples << 2);
    memset(outputs[1],0,(ulong)samples << 2);
    return;
  }
  pdVar4 = (double *)((long)param + 0x118);
  pdVar6 = (double *)((long)param + 0x38);
  lVar8 = 8;
  do {
    switch(*(undefined1 *)((long)param + lVar8)) {
    case 0:
      dVar12 = (double)*(int *)((long)param + 0x148) * 0.00390625;
      break;
    case 1:
      dVar12 = (double)*(int *)((long)param + 0x148) * 0.001953125;
      break;
    case 2:
      dVar12 = (double)*(int *)((long)param + 0x148) * 0.0009765625;
      break;
    case 3:
      dVar12 = *pdVar6;
      goto LAB_0016cb25;
    default:
      goto switchD_0016cae4_default;
    }
    dVar12 = dVar12 + dVar12;
LAB_0016cb25:
    *pdVar4 = dVar12;
switchD_0016cae4_default:
    pdVar4 = pdVar4 + 3;
    lVar8 = lVar8 + 1;
    pdVar6 = pdVar6 + 0xf;
    if (lVar8 != 9) {
      iVar5 = *(int *)((long)param + 0x148) + 0x80;
      iVar2 = *(int *)((long)param + 0x148) + 0x17f;
      if (-1 < iVar5) {
        iVar2 = iVar5;
      }
      if (samples != 0) {
        uVar10 = 0;
        do {
          uVar9 = 0;
          local_4c = 0;
          local_50 = 0;
          do {
            pbVar1 = (byte *)((long)param + uVar9 * 0x28 + 0x20);
            if ((*(double *)(pbVar1 + 0x18) == 0.0) && (!NAN(*(double *)(pbVar1 + 0x18)))) {
              *(double *)(pbVar1 + 0x18) =
                   (double)((iVar2 >> 8) << (pbVar1[3] & 0x1f)) / (double)(*pbVar1 ^ 0x1ff);
            }
            dVar12 = *(double *)(pbVar1 + 0x10) - *(double *)(pbVar1 + 0x18);
            *(double *)(pbVar1 + 0x10) = dVar12;
            while (dVar12 < 0.0) {
              *(double *)(pbVar1 + 0x18) =
                   (double)((iVar2 >> 8) << (pbVar1[3] & 0x1f)) / (511.0 - (double)*pbVar1);
              *(double *)(pbVar1 + 0x10) = dVar12 + *(double *)((long)param + 0x140);
              pbVar1[0x20] = pbVar1[0x20] ^ 1;
              if ((int)uVar9 == 4) {
LAB_0016cc48:
                if (*(char *)((long)param + 0x13) == '\0') {
                  iVar5 = 1;
LAB_0016cc58:
                  saa1099_envelope_w((saa1099_state *)param,iVar5);
                }
              }
              else if ((int)uVar9 == 1) {
                if (*(char *)((long)param + 0x12) == '\0') {
                  iVar5 = 0;
                  goto LAB_0016cc58;
                }
                if (uVar9 == 4) goto LAB_0016cc48;
              }
              dVar12 = *(double *)(pbVar1 + 0x10);
            }
            if (pbVar1[0x21] == 0) {
              if (pbVar1[2] == 0) {
                uVar3 = 0;
              }
              else {
                uVar3 = -(uint)((*(byte *)((long)param + ((uVar9 & 0xffffffff) / 3) * 0x18 + 0x120)
                                & 1) == 0) | 1;
              }
              if (pbVar1[1] != 0) {
                uVar3 = uVar3 + (-(uint)((pbVar1[0x20] & 1) == 0) | 1);
              }
              iVar7 = (uint)pbVar1[0xc] * *(int *)(pbVar1 + 4) * uVar3;
              iVar5 = iVar7 + 0x1f;
              if (-1 < iVar7) {
                iVar5 = iVar7;
              }
              local_50 = local_50 + (iVar5 >> 5);
              iVar7 = (uint)pbVar1[0xd] * uVar3 * *(int *)(pbVar1 + 8);
              iVar5 = iVar7 + 0x1f;
              if (-1 < iVar7) {
                iVar5 = iVar7;
              }
              local_4c = local_4c + (iVar5 >> 5);
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != 6);
          lVar8 = 0;
          do {
            dVar12 = *(double *)((long)param + lVar8 * 0x18 + 0x110) -
                     *(double *)((long)param + lVar8 * 0x18 + 0x118);
            *(double *)((long)param + lVar8 * 0x18 + 0x110) = dVar12;
            if (dVar12 < 0.0) {
              pdVar6 = (double *)((long)param + lVar8 * 0x18 + 0x110);
              uVar3 = *(uint *)(pdVar6 + 2);
              do {
                dVar12 = dVar12 + *(double *)((long)param + 0x140);
                uVar3 = ((uVar3 >> 10 ^ uVar3 >> 0x11) & 1) + uVar3 * 2;
              } while (dVar12 < 0.0);
              *pdVar6 = dVar12;
              *(uint *)(pdVar6 + 2) = uVar3;
            }
            bVar11 = lVar8 == 0;
            lVar8 = lVar8 + 1;
          } while (bVar11);
          (*outputs)[uVar10] = local_50 / 6;
          outputs[1][uVar10] = local_4c / 6;
          uVar10 = uVar10 + 1;
        } while (uVar10 != samples);
      }
      return;
    }
  } while( true );
}

Assistant:

static void saa1099m_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	saa1099_state *saa = (saa1099_state *)param;
	UINT32 j, ch;
	INT32 clk2div512;

	/* if the channels are disabled we're done */
	if (!saa->all_ch_enable)
	{
		/* init output data */
		memset(outputs[LEFT],0,samples*sizeof(*outputs[LEFT]));
		memset(outputs[RIGHT],0,samples*sizeof(*outputs[RIGHT]));
		return;
	}

	for (ch = 0; ch < 2; ch++)
	{
		switch (saa->noise_params[ch])
		{
		case 0: saa->noise[ch].freq = saa->master_clock/ 256.0 * 2; break;
		case 1: saa->noise[ch].freq = saa->master_clock/ 512.0 * 2; break;
		case 2: saa->noise[ch].freq = saa->master_clock/1024.0 * 2; break;
		case 3: saa->noise[ch].freq = saa->channels[ch * 3].freq;   break; // todo: this case will be m_master_clock/[ch*3's octave divisor, 0 is = 256*2, higher numbers are higher] * 2 if the tone generator phase reset bit (0x1c bit 1) is set.
		}
	}

	// clock fix thanks to http://www.vogons.org/viewtopic.php?p=344227#p344227
	//clk2div512 = 2 * saa->master_clock / 512;
	clk2div512 = (saa->master_clock + 128) / 256;
	
	/* fill all data needed */
	for( j = 0; j < samples; j++ )
	{
		DEV_SMPL output_l = 0, output_r = 0;

		/* for each channel */
		for (ch = 0; ch < 6; ch++)
		{
			struct saa1099_channel* saach = &saa->channels[ch];
			int outlvl;

			if (saach->freq == 0.0)
				saach->freq = (double)(clk2div512 << saach->octave) /
					(double)(511 - saach->frequency);

			/* check the actual position in the square wave */
			saach->counter -= saach->freq;
			while (saach->counter < 0)
			{
				/* calculate new frequency now after the half wave is updated */
				saach->freq = (double)(clk2div512 << saach->octave) /
					(double)(511.0 - saach->frequency);

				saach->counter += saa->sample_rate;
				saach->level ^= 1;

				/* eventually clock the envelope counters */
				if (ch == 1 && saa->env_clock[0] == 0)
					saa1099_envelope_w(saa, 0);
				else if (ch == 4 && saa->env_clock[1] == 0)
					saa1099_envelope_w(saa, 1);
			}

			if (saach->Muted)
				continue;	// placed here to ensure that envelopes are updated
			
#if 0
			// if the noise is enabled
			if (saach->noise_enable)
			{
				// if the noise level is high (noise 0: chan 0-2, noise 1: chan 3-5)
				if (saa->noise[ch/3].level & 1)
				{
					// subtract to avoid overflows, also use only half amplitude
					output_l -= saach->amplitude[ LEFT] * saach->envelope[ LEFT] / 16;
					output_r -= saach->amplitude[RIGHT] * saach->envelope[RIGHT] / 16;
				}
			}
			// if the square wave is enabled
			if (saach->freq_enable)
			{
				// if the channel level is high
				if (saach->level & 1)
				{
					output_l += saach->amplitude[ LEFT] * saach->envelope[ LEFT] / 16;
					output_r += saach->amplitude[RIGHT] * saach->envelope[RIGHT] / 16;
				}
			}
#else
			// Now with bipolar output. -Valley Bell
			outlvl = 0;
			if (saach->noise_enable)
				outlvl += (saa->noise[ch/3].level & 1) ? +1 : -1;
			if (saach->freq_enable)
				outlvl += (saach->level & 1) ? +1 : -1;
			output_l += outlvl * saach->amplitude[ LEFT] * saach->envelope[ LEFT] / 32;
			output_r += outlvl * saach->amplitude[RIGHT] * saach->envelope[RIGHT] / 32;
#endif
		}

		for (ch = 0; ch < 2; ch++)
		{
			/* update the state of the noise generator
			 * polynomial is x^18 + x^11 + x (i.e. 0x20400) and is a plain XOR, initial state is probably all 1s
			 * see http://www.vogons.org/viewtopic.php?f=9&t=51695 */
			saa->noise[ch].counter -= saa->noise[ch].freq;
			while (saa->noise[ch].counter < 0)
			{
				saa->noise[ch].counter += saa->sample_rate;
				if( ((saa->noise[ch].level & 0x20000) == 0) != ((saa->noise[ch].level & 0x0400) == 0) )
					saa->noise[ch].level = (saa->noise[ch].level << 1) | 1;
				else
					saa->noise[ch].level <<= 1;
			}
		}
		/* write sound data to the buffer */
		outputs[LEFT][j] = output_l / 6;
		outputs[RIGHT][j] = output_r / 6;
	}
}